

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O3

size_t __thiscall DSectorMarker::PropagateMark(DSectorMarker *this)

{
  uint32 *puVar1;
  uint uVar2;
  DSectorMarker *pDVar3;
  int iVar4;
  sector_t_conflict *psVar5;
  side_t *psVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  iVar4 = numsectors;
  if (sectors == (sector_t_conflict *)0x0) {
    iVar11 = 0;
LAB_003794f7:
    iVar4 = po_NumPolyobjs;
    if (polyobjs != (FPolyObj *)0x0) {
      iVar7 = this->PolyNum;
      iVar12 = po_NumPolyobjs;
      if (po_NumPolyobjs < iVar7) {
        iVar12 = iVar7;
      }
      lVar8 = (long)iVar7 * 0xf0;
      uVar10 = 0;
      do {
        if ((uint)(iVar12 - iVar7) == uVar10) goto LAB_00379589;
        pDVar3 = *(DSectorMarker **)((long)polyobjs->bbox + lVar8 + 0x3c);
        if (pDVar3 != (DSectorMarker *)0x0) {
          uVar2 = (pDVar3->super_DObject).ObjectFlags;
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 3) != 0) {
              (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
              (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
              GC::Gray = pDVar3;
            }
          }
          else {
            *(undefined8 *)((long)polyobjs->bbox + lVar8 + 0x3c) = 0;
          }
        }
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0xf0;
      } while (uVar10 != 0x78);
      uVar10 = 0x78;
LAB_00379589:
      iVar11 = (int)uVar10 * 0xf0 + iVar11;
      iVar7 = (int)uVar10 + iVar7;
      if (iVar7 < iVar4) {
        this->PolyNum = iVar7;
        goto LAB_00379660;
      }
    }
    iVar4 = numsides;
    if (sides == (side_t *)0x0) goto LAB_00379679;
    iVar7 = this->SideNum;
    iVar12 = numsides;
    if (numsides < iVar7) {
      iVar12 = iVar7;
    }
    lVar8 = (long)iVar7 * 0xc0;
    uVar10 = 0;
    do {
      psVar6 = sides;
      if (uVar10 == (uint)(iVar12 - iVar7)) goto LAB_0037964c;
      lVar13 = 0x38;
      do {
        pDVar3 = *(DSectorMarker **)((long)psVar6->textures + lVar13 + lVar8 + -0x10);
        if (pDVar3 != (DSectorMarker *)0x0) {
          uVar2 = (pDVar3->super_DObject).ObjectFlags;
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 3) != 0) {
              (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
              (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
              GC::Gray = pDVar3;
            }
          }
          else {
            *(undefined8 *)((long)psVar6->textures + lVar13 + lVar8 + -0x10) = 0;
          }
        }
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 200);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0xc0;
    } while (uVar10 != 0xf0);
    uVar10 = 0xf0;
LAB_0037964c:
    iVar11 = (int)uVar10 * 0xc0 + iVar11;
    iVar7 = (int)uVar10 + iVar7;
    if (iVar4 <= iVar7) goto LAB_00379679;
    this->SideNum = iVar7;
  }
  else {
    iVar7 = *(int *)&(this->super_DObject).field_0x24;
    lVar8 = (long)iVar7;
    iVar11 = numsectors;
    if (numsectors < iVar7) {
      iVar11 = iVar7;
    }
    lVar13 = lVar8 * 0x218 + 0x170;
    uVar10 = 0;
    do {
      psVar5 = sectors;
      if (uVar10 == (uint)(iVar11 - iVar7)) goto LAB_003794db;
      pDVar3 = (DSectorMarker *)sectors[uVar10 + lVar8].SoundTarget.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          sectors[uVar10 + lVar8].SoundTarget.field_0.p = (AActor *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar10 + lVar8].SecActTarget.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar10 + lVar8].SecActTarget.field_0.p = (ASectorAction *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar10 + lVar8].floordata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar10 + lVar8].floordata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar10 + lVar8].ceilingdata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar10 + lVar8].ceilingdata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar10 + lVar8].lightingdata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar10 + lVar8].lightingdata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      lVar9 = 0;
      do {
        pDVar3 = *(DSectorMarker **)((long)&psVar5->planes[0].xform.xOffs + lVar9 * 8 + lVar13);
        if (pDVar3 != (DSectorMarker *)0x0) {
          uVar2 = (pDVar3->super_DObject).ObjectFlags;
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 3) != 0) {
              (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
              (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
              GC::Gray = pDVar3;
            }
          }
          else {
            *(undefined8 *)((long)&psVar5->planes[0].xform.xOffs + lVar9 * 8 + lVar13) = 0;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      uVar10 = uVar10 + 1;
      lVar13 = lVar13 + 0x218;
    } while (uVar10 != 0x20);
    uVar10 = 0x20;
LAB_003794db:
    iVar11 = (int)uVar10 * 0x218;
    iVar7 = iVar7 + (int)uVar10;
    if (iVar4 <= iVar7) goto LAB_003794f7;
    *(int *)&(this->super_DObject).field_0x24 = iVar7;
  }
LAB_00379660:
  puVar1 = &(this->super_DObject).ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
  (this->super_DObject).GCNext = &GC::Gray->super_DObject;
  GC::Gray = this;
LAB_00379679:
  return (long)iVar11;
}

Assistant:

size_t DSectorMarker::PropagateMark()
{
	int i;
	int marked = 0;
	bool moretodo = false;

	if (sectors != NULL)
	{
		for (i = 0; i < SECTORSTEPSIZE && SecNum + i < numsectors; ++i)
		{
			sector_t *sec = &sectors[SecNum + i];
			GC::Mark(sec->SoundTarget);
			GC::Mark(sec->SecActTarget);
			GC::Mark(sec->floordata);
			GC::Mark(sec->ceilingdata);
			GC::Mark(sec->lightingdata);
			for(int j=0;j<4;j++) GC::Mark(sec->interpolations[j]);
		}
		marked += i * sizeof(sector_t);
		if (SecNum + i < numsectors)
		{
			SecNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && polyobjs != NULL)
	{
		for (i = 0; i < POLYSTEPSIZE && PolyNum + i < po_NumPolyobjs; ++i)
		{
			GC::Mark(polyobjs[PolyNum + i].interpolation);
		}
		marked += i * sizeof(FPolyObj);
		if (PolyNum + i < po_NumPolyobjs)
		{
			PolyNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && sides != NULL)
	{
		for (i = 0; i < SIDEDEFSTEPSIZE && SideNum + i < numsides; ++i)
		{
			side_t *side = &sides[SideNum + i];
			for(int j=0;j<3;j++) GC::Mark(side->textures[j].interpolation);
		}
		marked += i * sizeof(side_t);
		if (SideNum + i < numsides)
		{
			SideNum += i;
			moretodo = true;
		}
	}
	// If there are more sectors to mark, put ourself back into the gray
	// list.
	if (moretodo)
	{
		Black2Gray();
		GCNext = GC::Gray;
		GC::Gray = this;
	}
	return marked;
}